

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O3

void av1_lookahead_destroy(lookahead_ctx *ctx)

{
  lookahead_entry *__ptr;
  long lVar1;
  long lVar2;
  
  if (ctx != (lookahead_ctx *)0x0) {
    __ptr = ctx->buf;
    if (__ptr != (lookahead_entry *)0x0) {
      if (0 < ctx->max_sz) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          aom_free_frame_buffer
                    ((YV12_BUFFER_CONFIG *)((long)(ctx->buf->img).store_buf_adr + lVar1 + -0x48));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0xf0;
        } while (lVar2 < ctx->max_sz);
        __ptr = ctx->buf;
      }
      free(__ptr);
    }
    free(ctx);
    return;
  }
  return;
}

Assistant:

void av1_lookahead_destroy(struct lookahead_ctx *ctx) {
  if (ctx) {
    if (ctx->buf) {
      int i;

      for (i = 0; i < ctx->max_sz; i++) aom_free_frame_buffer(&ctx->buf[i].img);
      free(ctx->buf);
    }
    free(ctx);
  }
}